

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileImporter::CreateDataFromImport(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  undefined1 auVar1 [16];
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> uVar2;
  pointer ppaVar3;
  bool bVar4;
  aiNode *this_00;
  ulong uVar5;
  size_type sVar6;
  pointer ppaVar7;
  const_reference ppOVar8;
  aiNode **ppaVar9;
  aiMesh **ppaVar10;
  __uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> _Var11;
  reference ppaVar12;
  aiMesh *this_01;
  pointer paVar13;
  aiVector3D *paVar14;
  aiVector3t<float> *paVar15;
  DeadlyImportError *pDVar16;
  aiColor4D *paVar17;
  uint *puVar18;
  aiColor4t<float> *local_1c0;
  aiVector3t<float> *local_180;
  aiVector3t<float> *local_150;
  allocator<char> local_d9;
  string local_d8;
  aiColor4t<float> local_b8;
  const_reference local_a8;
  aiVector3D *color;
  uint i;
  uint local_74;
  uint n;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  size_t index_2;
  size_t index_1;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  size_t index;
  uint local_30;
  uint childCount;
  uint meshCount;
  aiScene *pScene_local;
  Model *pModel_local;
  ObjFileImporter *this_local;
  
  if (pModel != (Model *)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0xaf,
                    "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                   );
    }
    aiString::Set(&pScene->mRootNode->mName,&pModel->m_ModelName);
    sVar6 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::size
                      (&pModel->m_Objects);
    if (sVar6 == 0) {
      bVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                        (&pModel->m_Vertices);
      if (!bVar4) {
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::
        unique_ptr<std::default_delete<aiMesh>,void>
                  ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&stack0xffffffffffffff90,
                   this_01);
        paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                             &stack0xffffffffffffff90);
        paVar13->mPrimitiveTypes = 1;
        sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&pModel->m_Vertices);
        local_74 = (uint)sVar6;
        paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                             &stack0xffffffffffffff90);
        paVar13->mNumVertices = (uint)sVar6;
        uVar5 = (ulong)local_74;
        paVar14 = (aiVector3D *)operator_new__(uVar5 * 0xc);
        if (uVar5 != 0) {
          local_150 = paVar14;
          do {
            aiVector3t<float>::aiVector3t(local_150);
            local_150 = local_150 + 1;
          } while (local_150 != paVar14 + uVar5);
        }
        paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                             &stack0xffffffffffffff90);
        paVar13->mVertices = paVar14;
        paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                             &stack0xffffffffffffff90);
        paVar14 = paVar13->mVertices;
        paVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                            (&pModel->m_Vertices);
        memcpy(paVar14,paVar15,(ulong)local_74 * 0xc);
        bVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                          (&pModel->m_Normals);
        if (!bVar4) {
          uVar5 = (ulong)local_74;
          paVar14 = (aiVector3D *)operator_new__(uVar5 * 0xc);
          if (uVar5 != 0) {
            local_180 = paVar14;
            do {
              aiVector3t<float>::aiVector3t(local_180);
              local_180 = local_180 + 1;
            } while (local_180 != paVar14 + uVar5);
          }
          paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                              ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                               &stack0xffffffffffffff90);
          paVar13->mNormals = paVar14;
          sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            (&pModel->m_Normals);
          if (sVar6 < local_74) {
            color._6_1_ = 1;
            pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"OBJ: vertex normal index out of range",
                       (allocator<char> *)((long)&color + 7));
            DeadlyImportError::DeadlyImportError(pDVar16,(string *)&i);
            color._6_1_ = 0;
            __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                              ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                               &stack0xffffffffffffff90);
          paVar14 = paVar13->mNormals;
          paVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                              (&pModel->m_Normals);
          memcpy(paVar14,paVar15,(ulong)local_74 * 0xc);
        }
        bVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                          (&pModel->m_VertexColors);
        if (!bVar4) {
          paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                              ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                               &stack0xffffffffffffff90);
          uVar5 = (ulong)paVar13->mNumVertices;
          paVar17 = (aiColor4D *)operator_new__(uVar5 << 4);
          if (uVar5 != 0) {
            local_1c0 = paVar17;
            do {
              aiColor4t<float>::aiColor4t(local_1c0);
              local_1c0 = local_1c0 + 1;
            } while (local_1c0 != paVar17 + uVar5);
          }
          paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                              ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                               &stack0xffffffffffffff90);
          paVar13->mColors[0] = paVar17;
          for (color._0_4_ = 0; (uint)color < local_74; color._0_4_ = (uint)color + 1) {
            uVar5 = (ulong)(uint)color;
            sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (&pModel->m_VertexColors);
            if (sVar6 <= uVar5) {
              pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d8,"OBJ: vertex color index out of range",&local_d9);
              DeadlyImportError::DeadlyImportError(pDVar16,&local_d8);
              __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            local_a8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                       operator[](&pModel->m_VertexColors,(ulong)(uint)color);
            aiColor4t<float>::aiColor4t(&local_b8,local_a8->x,local_a8->y,local_a8->z,1.0);
            paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                                ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                                 &stack0xffffffffffffff90);
            paVar17 = paVar13->mColors[0] + (uint)color;
            paVar17->r = local_b8.r;
            paVar17->g = local_b8.g;
            paVar17->b = local_b8.b;
            paVar17->a = local_b8.a;
          }
        }
        pScene->mRootNode->mNumMeshes = 1;
        puVar18 = (uint *)operator_new__(4);
        pScene->mRootNode->mMeshes = puVar18;
        *pScene->mRootNode->mMeshes = 0;
        ppaVar10 = (aiMesh **)operator_new__(8);
        pScene->mMeshes = ppaVar10;
        pScene->mNumMeshes = 1;
        paVar13 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release
                            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)
                             &stack0xffffffffffffff90);
        *pScene->mMeshes = paVar13;
        std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                  ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffff90);
      }
    }
    else {
      local_30 = 0;
      index._4_4_ = 0;
      for (MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppaVar3 = MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
          ppaVar7 = (pointer)std::
                             vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                             ::size(&pModel->m_Objects), ppaVar3 < ppaVar7;
          MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
        ppOVar8 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                  ::operator[](&pModel->m_Objects,
                               (size_type)
                               MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (*ppOVar8 != (value_type)0x0) {
          index._4_4_ = index._4_4_ + 1;
          ppOVar8 = std::
                    vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::
                    operator[](&pModel->m_Objects,
                               (size_type)
                               MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&(*ppOVar8)->m_Meshes);
          local_30 = (int)sVar6 + local_30;
        }
      }
      ppaVar9 = (aiNode **)operator_new__((ulong)index._4_4_ << 3);
      pScene->mRootNode->mChildren = ppaVar9;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1,(ulong)local_30);
      for (index_2 = 0;
          sVar6 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                  ::size(&pModel->m_Objects), index_2 < sVar6; index_2 = index_2 + 1) {
        ppOVar8 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                  ::operator[](&pModel->m_Objects,index_2);
        createNodes(this,pModel,*ppOVar8,pScene->mRootNode,pScene,
                    (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1);
      }
      if (pScene->mRootNode->mNumChildren != index._4_4_) {
        __assert_fail("pScene->mRootNode->mNumChildren == childCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                      ,200,
                      "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                     );
      }
      if (pScene->mNumMeshes != 0) {
        sVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar6;
        uVar5 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        ppaVar10 = (aiMesh **)operator_new__(uVar5);
        pScene->mMeshes = ppaVar10;
        for (mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
                  (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
                  (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
            uVar2._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
                 mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl,
            _Var11.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)
                 std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                           ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1),
            (ulong)uVar2._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl <
            (ulong)_Var11.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
            mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
                 (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
                 ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 1)) {
          ppaVar12 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                               ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1,
                                (size_type)
                                mesh._M_t.
                                super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
          pScene->mMeshes
          [(long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl] = *ppaVar12;
        }
      }
      createMaterials(this,pModel,pScene);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&index_1);
    }
  }
  return;
}

Assistant:

void ObjFileImporter::CreateDataFromImport(const ObjFile::Model* pModel, aiScene* pScene) {
    if( 0L == pModel ) {
        return;
    }

    // Create the root node of the scene
    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        // Set the name of the scene
        pScene->mRootNode->mName.Set(pModel->m_ModelName);
    } else {
        // This is a fatal error, so break down the application
        ai_assert(false);
    }

    if (pModel->m_Objects.size() > 0) {

        unsigned int meshCount = 0;
        unsigned int childCount = 0;

        for(size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            if(pModel->m_Objects[index]) {
                ++childCount;
                meshCount += (unsigned int)pModel->m_Objects[index]->m_Meshes.size();
            }
        }

        // Allocate space for the child nodes on the root node
        pScene->mRootNode->mChildren = new aiNode*[ childCount ];

        // Create nodes for the whole scene
        std::vector<aiMesh*> MeshArray;
        MeshArray.reserve(meshCount);
        for (size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            createNodes(pModel, pModel->m_Objects[index], pScene->mRootNode, pScene, MeshArray);
        }

        ai_assert(pScene->mRootNode->mNumChildren == childCount);

        // Create mesh pointer buffer for this scene
        if (pScene->mNumMeshes > 0) {
            pScene->mMeshes = new aiMesh*[MeshArray.size()];
            for (size_t index = 0; index < MeshArray.size(); ++index) {
                pScene->mMeshes[index] = MeshArray[index];
            }
        }

        // Create all materials
        createMaterials(pModel, pScene);
    }else {
		if (pModel->m_Vertices.empty()){
			return;
		}

		std::unique_ptr<aiMesh> mesh( new aiMesh );
        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        unsigned int n = (unsigned int)pModel->m_Vertices.size();
        mesh->mNumVertices = n;

        mesh->mVertices = new aiVector3D[n];
        memcpy(mesh->mVertices, pModel->m_Vertices.data(), n*sizeof(aiVector3D) );

        if ( !pModel->m_Normals.empty() ) {
            mesh->mNormals = new aiVector3D[n];
            if (pModel->m_Normals.size() < n) {
                throw DeadlyImportError("OBJ: vertex normal index out of range");
            }
            memcpy(mesh->mNormals, pModel->m_Normals.data(), n*sizeof(aiVector3D));
        }

        if ( !pModel->m_VertexColors.empty() ){
            mesh->mColors[0] = new aiColor4D[mesh->mNumVertices];
            for (unsigned int i = 0; i < n; ++i) {
                if (i < pModel->m_VertexColors.size() ) {
                    const aiVector3D& color = pModel->m_VertexColors[i];
                    mesh->mColors[0][i] = aiColor4D(color.x, color.y, color.z, 1.0);
                }else {
                    throw DeadlyImportError("OBJ: vertex color index out of range");
                }
            }
        }

        pScene->mRootNode->mNumMeshes = 1;
        pScene->mRootNode->mMeshes = new unsigned int[1];
        pScene->mRootNode->mMeshes[0] = 0;
        pScene->mMeshes = new aiMesh*[1];
        pScene->mNumMeshes = 1;
        pScene->mMeshes[0] = mesh.release();
    }
}